

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

_Bool GetKeyWord(ConfigScanner *sc)

{
  long in_RDI;
  char *key;
  char ch;
  char *local_20;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  _Bool _Var1;
  
  if (in_RDI == 0) {
    _Var1 = false;
  }
  else {
    if (**(char **)(in_RDI + 0x18) == '\"') {
      *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + 1;
      local_20 = GetQuote(sc);
      if (local_20 == (char *)0x0) {
        return false;
      }
    }
    else {
      local_20 = GetString((ConfigScanner *)
                           CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
      if (local_20 == (char *)0x0) {
        return false;
      }
    }
    *(char **)(in_RDI + 0x48) = local_20;
    _Var1 = true;
  }
  return _Var1;
}

Assistant:

bool GetKeyWord(ConfigScanner *sc)
{
	if (sc == NULL)
	{
		return false;
	}
	char ch = *sc->ptr;
	char *key;
	if (ch == '"')
	{
		sc->ptr++;
		key = GetQuote(sc);
		if (key == NULL)
		{
			return false;
		}
	}
	else
	{
		key = GetString(sc);
		if (key == NULL)
		{
			return false;
		}
	}
	sc->current_key = key;
	return true;
}